

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::ReadMesh(ColladaParser *this,Mesh *pMesh)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  allocator local_39;
  string local_38;
  Mesh *local_18;
  Mesh *pMesh_local;
  ColladaParser *this_local;
  
  local_18 = pMesh;
  pMesh_local = (Mesh *)this;
  uVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((uVar2 & 1) == 0) {
    do {
      do {
        while( true ) {
          uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((uVar2 & 1) == 0) {
            return;
          }
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar3 != 1) break;
          bVar1 = IsElement(this,"source");
          if (bVar1) {
            ReadSource(this);
          }
          else {
            bVar1 = IsElement(this,"vertices");
            if (bVar1) {
              ReadVertexData(this,local_18);
            }
            else {
              bVar1 = IsElement(this,"triangles");
              if ((((bVar1) || (bVar1 = IsElement(this,"lines"), bVar1)) ||
                  (bVar1 = IsElement(this,"linestrips"), bVar1)) ||
                 (((bVar1 = IsElement(this,"polygons"), bVar1 ||
                   (bVar1 = IsElement(this,"polylist"), bVar1)) ||
                  ((bVar1 = IsElement(this,"trifans"), bVar1 ||
                   (bVar1 = IsElement(this,"tristrips"), bVar1)))))) {
                ReadIndexData(this,local_18);
              }
              else {
                SkipElement(this);
              }
            }
          }
        }
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar3 != 2);
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar3 = strcmp((char *)CONCAT44(extraout_var,iVar3),"technique_common");
    } while (iVar3 == 0);
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar3 = strcmp((char *)CONCAT44(extraout_var_00,iVar3),"mesh");
    if (iVar3 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_38,"Expected end of <mesh> element.",&local_39);
      ThrowException(this,&local_38);
    }
  }
  return;
}

Assistant:

void ColladaParser::ReadMesh(Mesh* pMesh)
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("source"))
            {
                // we have professionals dealing with this
                ReadSource();
            }
            else if (IsElement("vertices"))
            {
                // read per-vertex mesh data
                ReadVertexData(pMesh);
            }
            else if (IsElement("triangles") || IsElement("lines") || IsElement("linestrips")
                || IsElement("polygons") || IsElement("polylist") || IsElement("trifans") || IsElement("tristrips"))
            {
                // read per-index mesh data and faces setup
                ReadIndexData(pMesh);
            }
            else
            {
                // ignore the restf
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "technique_common") == 0)
            {
                // end of another meaningless element - read over it
            }
            else if (strcmp(mReader->getNodeName(), "mesh") == 0)
            {
                // end of <mesh> element - we're done here
                break;
            }
            else
            {
                // everything else should be punished
                ThrowException("Expected end of <mesh> element.");
            }
        }
    }
}